

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_PlayActiveSound
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__assertion;
  bool bVar4;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    this = (AActor *)(param->field_0).field_1.a;
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar4 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar4) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (bVar4) {
      AActor::PlayActiveSound(this);
      return 0;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0xdc1,
                "int AF_AActor_PlayActiveSound(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, PlayActiveSound)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->PlayActiveSound();
	return 0;
}